

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.h
# Opt level: O0

void booster::ptime::millisleep(longlong v)

{
  ptime pVar1;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  ptime local_18;
  
  pVar1 = milliseconds(CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  local_18.sec = pVar1.sec;
  local_18.nsec = pVar1.nsec;
  booster::ptime::sleep(&local_18);
  return;
}

Assistant:

static void millisleep(long long v)
		{
			sleep(milliseconds(v));
		}